

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O1

void writeJSONStreamFile(int version,Writer *jw,Stream *stream,int id,
                        qpdf_stream_decode_level_e decode_level,string *file_prefix)

{
  size_type *psVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  undefined8 *puVar5;
  FILE *__stream;
  uint uVar6;
  ulong uVar7;
  uint __len;
  pointer pcVar8;
  undefined8 uVar9;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string __str_1;
  Pl_StdioFile f_pl;
  
  psVar2 = &f_pl.super_Pipeline.identifier._M_string_length;
  pcVar8 = (file_prefix->_M_dataplus)._M_p;
  f_pl.super_Pipeline._vptr_Pipeline = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&f_pl,pcVar8,pcVar8 + file_prefix->_M_string_length);
  std::__cxx11::string::append((char *)&f_pl);
  __val = -id;
  if (0 < id) {
    __val = id;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00211eb9;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00211eb9;
      }
      if (uVar6 < 10000) goto LAB_00211eb9;
      uVar7 = uVar7 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00211eb9:
  paVar3 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&__str_1,(char)__len - (char)(id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (__str_1._M_dataplus._M_p + ((uint)id >> 0x1f),__len,__val);
  pcVar8 = (pointer)0xf;
  if (f_pl.super_Pipeline._vptr_Pipeline != (_func_int **)psVar2) {
    pcVar8 = (pointer)f_pl.super_Pipeline.identifier._M_string_length;
  }
  if (pcVar8 < f_pl.super_Pipeline.identifier._M_dataplus._M_p + __str_1._M_string_length) {
    uVar9 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar3) {
      uVar9 = __str_1.field_2._M_allocated_capacity;
    }
    if (f_pl.super_Pipeline.identifier._M_dataplus._M_p + __str_1._M_string_length <= (ulong)uVar9)
    {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&__str_1,0,(char *)0x0,(ulong)f_pl.super_Pipeline._vptr_Pipeline);
      goto LAB_00211f47;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&f_pl,(ulong)__str_1._M_dataplus._M_p);
LAB_00211f47:
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    filename.field_2._M_allocated_capacity = *psVar1;
    filename.field_2._8_8_ = puVar5[3];
  }
  else {
    filename.field_2._M_allocated_capacity = *psVar1;
    filename._M_dataplus._M_p = (pointer)*puVar5;
  }
  filename._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(char *)psVar1 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar3) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if (f_pl.super_Pipeline._vptr_Pipeline != (_func_int **)psVar2) {
    operator_delete(f_pl.super_Pipeline._vptr_Pipeline,
                    f_pl.super_Pipeline.identifier._M_string_length + 1);
  }
  __stream = (FILE *)QUtil::safe_fopen(filename._M_dataplus._M_p,"wb");
  Pl_StdioFile::Pl_StdioFile(&f_pl,"stream data",(FILE *)__stream);
  qpdf::Stream::writeStreamJSON
            (stream,version,jw,qpdf_sj_file,decode_level,&f_pl.super_Pipeline,&filename,false);
  Pl_StdioFile::finish(&f_pl);
  fclose(__stream);
  Pl_StdioFile::~Pl_StdioFile(&f_pl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
writeJSONStreamFile(
    int version,
    JSON::Writer& jw,
    qpdf::Stream& stream,
    int id,
    qpdf_stream_decode_level_e decode_level,
    std::string const& file_prefix)
{
    auto filename = file_prefix + "-" + std::to_string(id);
    auto* f = QUtil::safe_fopen(filename.c_str(), "wb");
    Pl_StdioFile f_pl{"stream data", f};
    stream.writeStreamJSON(version, jw, qpdf_sj_file, decode_level, &f_pl, filename);
    f_pl.finish();
    fclose(f);
}